

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall
Session::Session(Session *this,Slot *inSlot,bool inIsReadWrite,CK_VOID_PTR inPApplication,
                CK_NOTIFY inNotify)

{
  Token *pTVar1;
  undefined8 in_RCX;
  byte in_DL;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  
  *in_RDI = &PTR__Session_00223cf8;
  in_RDI[1] = in_RSI;
  pTVar1 = Slot::getToken((Slot *)in_RDI[1]);
  in_RDI[2] = pTVar1;
  *(byte *)(in_RDI + 5) = in_DL & 1;
  in_RDI[6] = 0;
  in_RDI[3] = in_RCX;
  in_RDI[4] = in_R8;
  *(undefined4 *)(in_RDI + 7) = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  *(undefined4 *)(in_RDI + 10) = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  *(undefined4 *)(in_RDI + 0xe) = 0;
  *(undefined1 *)(in_RDI + 0x11) = 0;
  *(undefined1 *)((long)in_RDI + 0x8a) = 0;
  *(undefined1 *)((long)in_RDI + 0x89) = 0;
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  in_RDI[0x14] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  return;
}

Assistant:

Session::Session(Slot* inSlot, bool inIsReadWrite, CK_VOID_PTR inPApplication, CK_NOTIFY inNotify)
{
	slot = inSlot;
	token = slot->getToken();
	isReadWrite = inIsReadWrite;
	hSession = CK_INVALID_HANDLE;
	pApplication = inPApplication;
	notify = inNotify;
	operation = SESSION_OP_NONE;
	findOp = NULL;
	digestOp = NULL;
	hashAlgo = HashAlgo::Unknown;
	macOp = NULL;
	asymmetricCryptoOp = NULL;
	symmetricCryptoOp = NULL;
	mechanism = AsymMech::Unknown;
	reAuthentication = false;
	allowSinglePartOp = false;
	allowMultiPartOp = false;
	publicKey = NULL;
	privateKey = NULL;
	symmetricKey = NULL;
	param = NULL;
	paramLen = 0;
}